

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O3

void __thiscall
backward::TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>::
~TraceResolverLinuxImpl
          (TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol> *this)

{
  pointer pcVar1;
  
  (this->super_TraceResolverLinuxBase).super_TraceResolverImplBase._vptr_TraceResolverImplBase =
       (_func_int **)&PTR__TraceResolverLinuxImpl_00197bb0;
  if ((this->_symbols)._empty == false) {
    free((this->_symbols)._val);
  }
  (this->super_TraceResolverLinuxBase).super_TraceResolverImplBase._vptr_TraceResolverImplBase =
       (_func_int **)&PTR__TraceResolverLinuxBase_00197be0;
  pcVar1 = (this->super_TraceResolverLinuxBase).exec_path_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_TraceResolverLinuxBase).exec_path_.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->super_TraceResolverLinuxBase).argv0_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_TraceResolverLinuxBase).argv0_.field_2) {
    operator_delete(pcVar1);
  }
  (this->super_TraceResolverLinuxBase).super_TraceResolverImplBase._vptr_TraceResolverImplBase =
       (_func_int **)&PTR__TraceResolverImplBase_00197c10;
  if ((this->super_TraceResolverLinuxBase).super_TraceResolverImplBase._demangler.
      super_demangler_impl<backward::system_tag::linux_tag>._demangle_buffer._empty == false) {
    free((this->super_TraceResolverLinuxBase).super_TraceResolverImplBase._demangler.
         super_demangler_impl<backward::system_tag::linux_tag>._demangle_buffer._val);
  }
  operator_delete(this);
  return;
}

Assistant:

void load_addresses(void *const*addresses, int address_count) override {
    if (address_count == 0) {
      return;
    }
    _symbols.reset(backtrace_symbols(addresses, address_count));
  }